

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropout_layer.c
# Opt level: O2

void dropout_layer_backward(layer_t *l)

{
  float *pfVar1;
  float fVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  
  iVar4 = l->n->batch;
  iVar5 = 0;
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  for (; iVar5 != iVar4; iVar5 = iVar5 + 1) {
    uVar3 = (l->in).size;
    uVar6 = 0;
    if (0 < (int)uVar3) {
      uVar6 = (ulong)uVar3;
    }
    lVar7 = (long)(int)(uVar3 * iVar5);
    for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
      fVar2 = *(float *)&l[1].func;
      pfVar1 = (l->extra).val + uVar8;
      if (fVar2 < *pfVar1 || fVar2 == *pfVar1) {
        (l->in).grad[lVar7 + uVar8] = (l->out).grad[lVar7 + uVar8] / (1.0 - fVar2);
      }
      else {
        (l->in).grad[lVar7 + uVar8] = 0.0;
      }
    }
  }
  return;
}

Assistant:

static void dropout_layer_backward(layer_t *l)
{
	int i = 0, b = 0;
	dropout_layer_t *drop = (dropout_layer_t *)l;

	for (b = 0; b < l->n->batch; ++b)
		for (i = 0; i < l->in.size; ++i)
		{
			if (l->extra.val[i] < drop->prob)
				l->in.grad[b * l->in.size + i] = 0;
			else
				l->in.grad[b * l->in.size + i] = l->out.grad[b * l->in.size + i] / (1 - drop->prob);
		}
}